

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_upvaluejoin(lua_State *L,int fidx1,int n1,int fidx2,int n2)

{
  UpVal *pUVar1;
  TValue *pTVar2;
  UpVal **ppUVar3;
  UpVal **ppUVar4;
  ravi_type_map t2;
  ravi_type_map t1;
  LClosure *f1;
  ravi_type_map local_40;
  ravi_type_map local_3c;
  LClosure *local_38;
  
  ppUVar3 = getupvalref(L,fidx1,n1,&local_38,&local_3c);
  ppUVar4 = getupvalref(L,fidx2,n2,(LClosure **)0x0,&local_40);
  if ((local_3c == local_40) && (*ppUVar3 != *ppUVar4)) {
    luaC_upvdeccount(L,*ppUVar3);
    pUVar1 = *ppUVar4;
    *ppUVar3 = pUVar1;
    pUVar1->refcount = pUVar1->refcount + 1;
    if (pUVar1->v != (TValue *)&pUVar1->u) {
      (pUVar1->u).open.touched = 1;
    }
    pTVar2 = (*ppUVar3)->v;
    if (pTVar2 == (TValue *)&(*ppUVar3)->u && (short)pTVar2->tt_ < 0) {
      luaC_upvalbarrier_(L,(pTVar2->value_).gc);
    }
  }
  return;
}

Assistant:

LUA_API void lua_upvaluejoin (lua_State *L, int fidx1, int n1,
                                            int fidx2, int n2) {
  LClosure *f1;
  ravi_type_map t1, t2;
  UpVal **up1 = getupvalref(L, fidx1, n1, &f1, &t1);
  UpVal **up2 = getupvalref(L, fidx2, n2, NULL, &t2);
  if (t1 == t2 && *up1 != *up2) {
    luaC_upvdeccount(L, *up1);
    *up1 = *up2;
    (*up1)->refcount++;
    if (upisopen(*up1)) (*up1)->u.open.touched = 1;
    luaC_upvalbarrier(L, *up1, (*up1)->v);
  }
}